

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  float fVar1;
  uint32 uVar2;
  vector_t pfVar3;
  void ***pppvVar4;
  void ***pppvVar5;
  long lVar6;
  void *pvVar7;
  float32 *pfVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  int iVar12;
  int32 iVar13;
  uint uVar14;
  cmd_ln_t *pcVar15;
  char *pcVar16;
  FILE *pFVar17;
  void *pvVar18;
  void ****ppppvVar19;
  float32 ***mixw;
  size_t sVar20;
  node *sroot;
  int32 **ppiVar21;
  int32 *piVar22;
  uint uVar23;
  char *pcVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  vector_t **pppfVar32;
  float32 **tmpptr;
  ulong uVar33;
  double dVar34;
  float fVar35;
  uint local_164;
  uint32 n_density;
  uint32 n_stream;
  int32 *local_158;
  uint32 t_ndensity;
  ulong local_148;
  int local_140;
  uint32 t_nfeat;
  float32 **local_138;
  ulong local_130;
  FILE *local_128;
  uint local_11c;
  ulong local_118;
  void ****local_110;
  ulong local_108;
  ulong local_100;
  int32 **local_f8;
  void *local_f0;
  model_def_t *mdef;
  uint32 t_nstates;
  undefined8 local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  FILE *local_b8;
  uint32 *l_veclen;
  long local_a8;
  char *local_a0;
  ulong local_98;
  ulong local_90;
  vector_t ****local_88;
  vector_t ***fullvar;
  vector_t ***fullmean;
  uint32 *t_veclen;
  uint local_68;
  uint32 l_nstates;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  float32 ***in_mixw;
  uint32 n_in_mixw;
  
  parse_cmd_ln(argc,argv);
  pcVar15 = cmd_ln_get();
  pcVar16 = cmd_ln_str_r(pcVar15,"-type");
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n";
    lVar25 = 0x3fd;
    goto LAB_00105cbf;
  }
  local_140 = strcmp(pcVar16,".cont.");
  if (local_140 == 0) {
    local_d8 = 1;
LAB_00104c5f:
    pcVar15 = cmd_ln_get();
    pcVar16 = cmd_ln_str_r(pcVar15,"-questfn");
    pcVar15 = cmd_ln_get();
    local_a8 = cmd_ln_int_r(pcVar15,"-npermute");
    pcVar15 = cmd_ln_get();
    local_48 = cmd_ln_int_r(pcVar15,"-qstperstt");
    local_a0 = pcVar16;
    pFVar17 = fopen(pcVar16,"w");
    if (pFVar17 != (FILE *)0x0) {
      fwrite("WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n",0x36,1,pFVar17);
      fclose(pFVar17);
      fullmean = (vector_t ***)0x0;
      fullvar = (vector_t ***)0x0;
      local_88 = (vector_t ****)0x0;
      pcVar15 = cmd_ln_get();
      pcVar16 = cmd_ln_str_r(pcVar15,"-moddeffn");
      if (pcVar16 == (char *)0x0) {
        pcVar16 = "Specify -moddeffn\n";
        lVar25 = 0x316;
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                ,0x318,"Reading: %s\n",pcVar16);
        iVar13 = model_def_read(&mdef,pcVar16);
        if (iVar13 == 0) {
          uVar14 = mdef->acmod_set->n_ci;
          uVar33 = (ulong)uVar14;
          pvVar18 = __ckd_calloc_2d__(uVar33,100,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                      ,0x31e);
          uVar28 = uVar14 - 1;
          if (uVar14 != 0) {
            uVar27 = 0;
            do {
              pcVar16 = *(char **)((long)pvVar18 + uVar27 * 8);
              pcVar24 = acmod_set_id2name(mdef->acmod_set,(acmod_id_t)uVar27);
              strcpy(pcVar16,pcVar24);
              uVar27 = uVar27 + 1;
            } while (uVar33 != uVar27);
          }
          uVar14 = *mdef->defn->state;
          pcVar15 = cmd_ln_get();
          pcVar16 = cmd_ln_str_r(pcVar15,"-mixwfn");
          if (pcVar16 == (char *)0x0) {
            pcVar16 = "Specify -mixwfn\n";
            lVar25 = 0x329;
            goto LAB_00105cbf;
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                  ,0x32b,"Reading: %s\n",pcVar16);
          iVar12 = s3mixw_read(pcVar16,&in_mixw,&n_in_mixw,&n_stream,&n_density);
          if (iVar12 == 0) {
            uVar2 = mdef->defn->n_state;
            local_118 = (ulong)n_stream;
            local_11c = n_density;
            if (uVar28 != 0) {
              uVar23 = 1;
              do {
                if (mdef->defn[uVar23].n_state != uVar2) {
                  pcVar16 = "Models do not have uniform topology\n";
                  lVar25 = 0x33b;
                  goto LAB_00105cbf;
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 <= uVar28);
            }
            local_138 = (float32 **)CONCAT44(local_138._4_4_,uVar28);
            uVar27 = (ulong)(uVar2 - 1);
            local_130 = uVar27;
            local_c0 = __ckd_calloc_2d__(uVar33,uVar27,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x347);
            uVar30 = 0;
            do {
              if ((uint)local_130 != 0) {
                uVar26 = 0;
                do {
                  *(float32 ***)(*(long *)((long)local_c0 + uVar30 * 8) + uVar26 * 8) =
                       in_mixw[mdef->defn[uVar30].state[uVar26] - uVar14];
                  uVar26 = uVar26 + 1;
                } while (uVar27 != uVar26);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar33);
            local_100 = uVar33;
            local_f0 = pvVar18;
            local_98 = uVar27;
            if (local_140 != 0) {
              ppppvVar19 = __ckd_calloc_4d__(uVar33,uVar27,(ulong)n_stream,(ulong)n_density,4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                             ,0x3c4);
              uVar33 = 0;
              local_164 = 0;
              do {
                pcVar16 = *(char **)((long)local_f0 + uVar33 * 8);
                pcVar24 = strchr(pcVar16,0x2b);
                if ((pcVar24 == (char *)0x0) && (iVar12 = strcmp(pcVar16,"SIL"), iVar12 != 0)) {
                  strcpy(*(char **)((long)local_f0 + (ulong)local_164 * 8),pcVar16);
                  if ((uint)local_130 != 0) {
                    uVar30 = 0;
                    do {
                      if ((ulong)n_stream != 0) {
                        uVar26 = 0;
                        do {
                          if ((ulong)n_density != 0) {
                            lVar25 = *(long *)(*(long *)(*(long *)((long)local_c0 + uVar33 * 8) +
                                                        uVar30 * 8) + uVar26 * 8);
                            pvVar18 = ppppvVar19[local_164][uVar30][uVar26];
                            uVar31 = 0;
                            do {
                              *(undefined4 *)((long)pvVar18 + uVar31 * 4) =
                                   *(undefined4 *)(lVar25 + uVar31 * 4);
                              uVar31 = uVar31 + 1;
                            } while (n_density != uVar31);
                          }
                          uVar26 = uVar26 + 1;
                        } while (uVar26 != n_stream);
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar27);
                  }
                  local_164 = local_164 + 1;
                }
                uVar33 = uVar33 + 1;
              } while (uVar33 != local_100);
              local_108 = 0;
              local_c8 = (void *)0x0;
              local_d0 = (void *)0x0;
              uVar33 = local_118;
              uVar14 = local_11c;
              goto LAB_00105625;
            }
            pcVar15 = cmd_ln_get();
            lVar25 = cmd_ln_int_r(pcVar15,"-fullvar");
            pcVar15 = cmd_ln_get();
            pcVar16 = cmd_ln_str_r(pcVar15,"-meanfn");
            iVar12 = s3gau_read(pcVar16,&fullmean,&l_nstates,&t_nfeat,&t_ndensity,&l_veclen);
            if (iVar12 != 0) {
              pcVar15 = cmd_ln_get();
              pcVar16 = cmd_ln_str_r(pcVar15,"-meanfn");
              pcVar24 = "Error reading mean file %s\n";
              lVar25 = 0x35d;
              goto LAB_00105e50;
            }
            uVar28 = *l_veclen;
            if ((t_nfeat != n_stream) && (t_ndensity != n_density)) {
              pcVar16 = "Mismatch between Mean and Mixture weight files\n";
              lVar25 = 0x360;
              goto LAB_00105cbf;
            }
            pcVar15 = cmd_ln_get();
            pcVar16 = cmd_ln_str_r(pcVar15,"-varfn");
            if ((int)lVar25 == 0) {
              iVar12 = s3gau_read(pcVar16,&fullvar,&t_nstates,&t_nfeat,&t_ndensity,&t_veclen);
              if (iVar12 == 0) goto LAB_0010516c;
              pcVar15 = cmd_ln_get();
              pcVar16 = cmd_ln_str_r(pcVar15,"-varfn");
              pcVar24 = "Error reading var file %s\n";
              lVar25 = 0x372;
            }
            else {
              iVar12 = s3gau_read_full(pcVar16,&local_88,&t_nstates,&t_nfeat,&t_ndensity,&t_veclen);
              if (iVar12 == 0) {
LAB_0010516c:
                if ((t_nfeat == n_stream) || (t_ndensity == n_density)) {
                  if (n_stream != 0) {
                    uVar30 = 0;
                    do {
                      if (t_veclen[uVar30] != l_veclen[uVar30]) {
                        err_msg(ERR_FATAL,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x378,
                                "Feature length %d in var file != %d in mean file for feature %d\n",
                                (ulong)t_veclen[uVar30],(ulong)l_veclen[uVar30],uVar30);
                        goto LAB_00105ca2;
                      }
                      uVar30 = uVar30 + 1;
                    } while (n_stream != uVar30);
                  }
                  if (l_nstates == t_nstates) {
                    if (t_nfeat < 2) {
                      if (1 < t_ndensity) {
                        err_msg(ERR_WARN,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x37f,
                                "The state distributions given have %d gaussians per state;\n..*..shrinking them down to 1 gau per state..\n"
                               );
                      }
                      uVar30 = 0;
                      if (n_stream != 0) {
                        uVar26 = 0;
                        do {
                          uVar23 = (int)uVar30 + t_veclen[uVar26];
                          uVar30 = (ulong)uVar23;
                          uVar26 = uVar26 + 1;
                        } while (n_stream != uVar26);
                        uVar30 = (ulong)uVar23;
                      }
                      local_108 = (ulong)uVar28;
                      local_c8 = __ckd_calloc_3d__(uVar33,uVar27,uVar30,4,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x385);
                      local_d0 = __ckd_calloc_3d__(uVar33,uVar27,uVar30,4,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x387);
                      ppppvVar19 = __ckd_calloc_4d__(uVar33,uVar27,1,1,4,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x388);
                      pcVar15 = cmd_ln_get();
                      dVar34 = cmd_ln_float_r(pcVar15,"-varfloor");
                      pFVar17 = (FILE *)0x0;
                      do {
                        local_128 = pFVar17;
                        local_110 = ppppvVar19;
                        if ((uint)local_130 != 0) {
                          local_f8 = *(int32 ***)((long)local_c8 + (long)local_128 * 8);
                          local_90 = *(ulong *)((long)local_d0 + (long)local_128 * 8);
                          uVar30 = (ulong)*l_veclen;
                          uVar33 = 0;
                          do {
                            piVar22 = local_f8[uVar33];
                            local_b8 = local_128;
                            if ((ulong)n_density == 0) {
                              fVar11 = 0.0;
LAB_001054bb:
                              if (uVar30 != 0) {
                                uVar26 = 0;
                                do {
                                  fVar1 = (float)piVar22[uVar26];
                                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                                    err_msg(ERR_FATAL,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                            ,0x3aa,
                                            "dnom = 0, but featmean[nn] != 0, =  %f for ll = %d\n",
                                            (double)fVar1,0);
                                    goto LAB_00105ca2;
                                  }
                                  uVar26 = uVar26 + 1;
                                } while (uVar30 != uVar26);
                              }
                            }
                            else {
                              lVar9 = *(long *)(local_90 + uVar33 * 8);
                              lVar10 = **(long **)(*(long *)((long)local_c0 + (long)local_128 * 8) +
                                                  uVar33 * 8);
                              local_158 = (int32 *)CONCAT44(local_158._4_4_,uVar14);
                              fVar11 = 0.0;
                              uVar27 = 0;
                              do {
                                fVar1 = *(float *)(lVar10 + uVar27 * 4);
                                if (uVar30 != 0) {
                                  pfVar3 = (*fullmean[uVar14])[uVar27];
                                  uVar26 = 0;
                                  do {
                                    piVar22[uVar26] =
                                         (int32)(pfVar3[uVar26] * fVar1 + (float)piVar22[uVar26]);
                                    if ((int)lVar25 == 0) {
                                      pppfVar32 = fullvar[uVar14];
                                      uVar31 = uVar27;
                                    }
                                    else {
                                      pppfVar32 = *local_88[uVar14] + uVar27;
                                      uVar31 = uVar26;
                                    }
                                    fVar35 = pfVar3[uVar26];
                                    *(float *)(lVar9 + uVar26 * 4) =
                                         (fVar35 * fVar35 + (*pppfVar32)[uVar31][uVar26]) * fVar1 +
                                         *(float *)(lVar9 + uVar26 * 4);
                                    uVar26 = uVar26 + 1;
                                  } while (uVar30 != uVar26);
                                }
                                fVar11 = fVar11 + fVar1;
                                uVar27 = uVar27 + 1;
                              } while (uVar27 != n_density);
                              uVar27 = local_98;
                              local_148 = uVar33;
                              if ((fVar11 == 0.0) && (!NAN(fVar11))) goto LAB_001054bb;
                              if (uVar30 != 0) {
                                uVar26 = 0;
                                do {
                                  fVar1 = (float)piVar22[uVar26] / fVar11;
                                  piVar22[uVar26] = (int32)fVar1;
                                  fVar1 = *(float *)(lVar9 + uVar26 * 4) / fVar11 - fVar1 * fVar1;
                                  fVar35 = (float)dVar34;
                                  if ((float)dVar34 <= fVar1) {
                                    fVar35 = fVar1;
                                  }
                                  *(float *)(lVar9 + uVar26 * 4) = fVar35;
                                  uVar26 = uVar26 + 1;
                                } while (uVar30 != uVar26);
                              }
                            }
                            *(float *)*ppppvVar19[(long)local_128][uVar33] = fVar11;
                            uVar33 = uVar33 + 1;
                            uVar14 = uVar14 + 1;
                          } while (uVar33 != uVar27);
                        }
                        uVar28 = (int)local_128 + 1;
                        pFVar17 = (FILE *)(ulong)uVar28;
                      } while (uVar28 <= (uint)local_138);
                      uVar33 = 0;
                      local_164 = 0;
                      do {
                        pcVar16 = *(char **)((long)local_f0 + uVar33 * 8);
                        pcVar24 = strchr(pcVar16,0x2b);
                        if ((pcVar24 == (char *)0x0) &&
                           (iVar12 = strcmp(pcVar16,"SIL"), iVar12 != 0)) {
                          uVar30 = (ulong)local_164;
                          strcpy(*(char **)((long)local_f0 + uVar30 * 8),pcVar16);
                          if ((uint)local_130 != 0) {
                            pppvVar4 = local_110[uVar33];
                            pppvVar5 = local_110[uVar30];
                            uVar14 = *l_veclen;
                            uVar26 = 0;
                            do {
                              *(undefined4 *)*pppvVar5[uVar26] = **pppvVar4[uVar26];
                              if ((ulong)uVar14 != 0) {
                                lVar25 = *(long *)(*(long *)((long)local_c8 + uVar33 * 8) +
                                                  uVar26 * 8);
                                lVar9 = *(long *)(*(long *)((long)local_c8 + uVar30 * 8) +
                                                 uVar26 * 8);
                                lVar10 = *(long *)(*(long *)((long)local_d0 + uVar33 * 8) +
                                                  uVar26 * 8);
                                lVar6 = *(long *)(*(long *)((long)local_d0 + uVar30 * 8) +
                                                 uVar26 * 8);
                                uVar31 = 0;
                                do {
                                  *(undefined4 *)(lVar9 + uVar31 * 4) =
                                       *(undefined4 *)(lVar25 + uVar31 * 4);
                                  *(undefined4 *)(lVar6 + uVar31 * 4) =
                                       *(undefined4 *)(lVar10 + uVar31 * 4);
                                  uVar31 = uVar31 + 1;
                                } while (uVar14 != uVar31);
                              }
                              uVar26 = uVar26 + 1;
                            } while (uVar26 != uVar27);
                          }
                          local_164 = local_164 + 1;
                          ppppvVar19 = local_110;
                        }
                        uVar33 = uVar33 + 1;
                      } while (uVar33 != local_100);
                      uVar33 = 1;
                      uVar14 = 1;
LAB_00105625:
                      if (local_140 == 0) {
                        ckd_free_4d(fullmean);
                        if (fullvar != (vector_t ***)0x0) {
                          ckd_free_4d(fullvar);
                        }
                        if (local_88 != (vector_t ****)0x0) {
                          gauden_free_param_full(local_88);
                        }
                      }
                      if ((uint)local_130 != 0) {
                        local_100 = (ulong)local_164;
                        local_58 = uVar33 & 0xffffffff;
                        pvVar18 = (void *)(ulong)uVar14;
                        local_60 = local_108 & 0xffffffff;
                        local_50 = (ulong)(local_164 * (uint)local_130);
                        local_130 = (ulong)((uint)local_130 >> 1);
                        local_148 = 0;
                        local_138 = (float32 **)0x0;
                        local_128 = (FILE *)0x0;
                        local_11c = uVar14;
                        local_118 = uVar33;
                        local_110 = ppppvVar19;
                        local_c0 = pvVar18;
                        do {
                          uVar33 = local_100;
                          uVar14 = local_11c;
                          local_158 = (int32 *)__ckd_calloc__(local_100,4,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x425);
                          __ckd_calloc__(1,0x30,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x426);
                          mixw = (float32 ***)
                                 __ckd_calloc_3d__(uVar33,local_58,(size_t)pvVar18,4,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x428);
                          pFVar17 = local_128;
                          tmpptr = local_138;
                          if (local_140 == 0) {
                            local_138 = (float32 **)
                                        __ckd_calloc_2d__(uVar33,local_60,4,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x42a);
                            uVar27 = local_60;
                            pFVar17 = (FILE *)__ckd_calloc_2d__(uVar33,local_60,4,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x42b);
                            tmpptr = local_138;
                            if (local_164 != 0) {
                              uVar33 = 0;
                              do {
                                local_158[uVar33] = (int32)uVar33;
                                **mixw[uVar33] = **ppppvVar19[uVar33][local_148];
                                if ((int)local_108 != 0) {
                                  lVar25 = *(long *)(*(long *)((long)local_c8 + uVar33 * 8) +
                                                    local_148 * 8);
                                  pfVar8 = local_138[uVar33];
                                  lVar9 = *(long *)(*(long *)((long)local_d0 + uVar33 * 8) +
                                                   local_148 * 8);
                                  lVar10 = *(long *)(&pFVar17->_flags + uVar33 * 2);
                                  sVar20 = 0;
                                  do {
                                    pfVar8[sVar20] = *(float32 *)(lVar25 + sVar20 * 4);
                                    *(undefined4 *)(lVar10 + sVar20 * 4) =
                                         *(undefined4 *)(lVar9 + sVar20 * 4);
                                    sVar20 = sVar20 + 1;
                                  } while (uVar27 != sVar20);
                                }
                                uVar33 = uVar33 + 1;
                                local_128 = pFVar17;
                              } while (uVar33 != local_100);
                              goto LAB_001058bb;
                            }
                            sroot = make_tree(local_138,(float32 **)pFVar17,mixw,local_158,0,uVar14,
                                              (int32)local_118,(int)local_108,(int32)local_a8,0,
                                              (int32)local_d8);
LAB_00105996:
                            ckd_free_2d(tmpptr);
                            ckd_free_2d(pFVar17);
                          }
                          else if (local_164 == 0) {
                            sroot = make_tree(local_138,(float32 **)local_128,mixw,local_158,0,
                                              uVar14,(int)local_118,(int32)local_108,(int32)local_a8
                                              ,0,(int32)local_d8);
                          }
                          else {
                            sVar20 = 0;
                            do {
                              local_158[sVar20] = (int32)sVar20;
                              if ((int)local_118 != 0) {
                                uVar27 = 0;
                                do {
                                  if (uVar14 != 0) {
                                    pvVar7 = ppppvVar19[sVar20][local_148][uVar27];
                                    pfVar8 = mixw[sVar20][uVar27];
                                    pvVar29 = (void *)0x0;
                                    do {
                                      pfVar8[(long)pvVar29] =
                                           *(float32 *)((long)pvVar7 + (long)pvVar29 * 4);
                                      pvVar29 = (void *)((long)pvVar29 + 1);
                                    } while (pvVar18 != pvVar29);
                                  }
                                  uVar27 = uVar27 + 1;
                                } while (uVar27 != local_58);
                              }
                              sVar20 = sVar20 + 1;
                            } while (sVar20 != uVar33);
LAB_001058bb:
                            pFVar17 = local_128;
                            tmpptr = local_138;
                            sroot = make_tree(local_138,(float32 **)local_128,mixw,local_158,
                                              local_164,uVar14,(int32)local_118,(int32)local_108,
                                              (int32)local_a8,0,(int32)local_d8);
                            if (local_140 == 0) goto LAB_00105996;
                          }
                          local_138 = tmpptr;
                          local_128 = pFVar17;
                          ckd_free_3d(mixw);
                          ckd_free(local_158);
                          uVar33 = local_50;
                          ppiVar21 = (int32 **)
                                     __ckd_calloc__(local_50,8,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x443);
                          piVar22 = (int32 *)__ckd_calloc__(uVar33,4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x444);
                          prune_quests(sroot,(int32)local_48);
                          local_f8 = ppiVar21;
                          uVar14 = get_quests(sroot,ppiVar21,piVar22,0,0);
                          free_tree(sroot);
                          pFVar17 = fopen(local_a0,"a");
                          if ((int)uVar14 < 1) {
                            fclose(pFVar17);
                            uVar33 = local_148;
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x455,"Done building questions using state %d\n",
                                    local_148 & 0xffffffff);
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x456," %d questions from state %d\n",(ulong)uVar14,
                                    uVar33 & 0xffffffff);
                            ppiVar21 = local_f8;
                          }
                          else {
                            local_90 = (ulong)uVar14;
                            uVar33 = 0;
                            local_158 = piVar22;
                            local_b8 = pFVar17;
                            local_68 = uVar14;
                            do {
                              piVar22 = local_158;
                              if (local_148 < local_130) {
                                pcVar16 = "QUESTION%d_%d_R ";
LAB_00105aa7:
                                fprintf(pFVar17,pcVar16,local_148,uVar33 & 0xffffffff);
                              }
                              else {
                                if (local_148 != local_130) {
                                  pcVar16 = "QUESTION%d_%d_L ";
                                  goto LAB_00105aa7;
                                }
                                fprintf(pFVar17,"QUESTION%d ",uVar33 & 0xffffffff);
                              }
                              pFVar17 = local_b8;
                              pvVar18 = local_f0;
                              ppiVar21 = local_f8;
                              if (0 < piVar22[uVar33]) {
                                lVar25 = 0;
                                do {
                                  fprintf(pFVar17," %s",
                                          *(undefined8 *)
                                           ((long)pvVar18 + (long)ppiVar21[uVar33][lVar25] * 8));
                                  lVar25 = lVar25 + 1;
                                } while (lVar25 < local_158[uVar33]);
                              }
                              fputc(10,pFVar17);
                              uVar27 = local_90;
                              pvVar18 = local_c0;
                              piVar22 = local_158;
                              uVar33 = uVar33 + 1;
                            } while (uVar33 != local_90);
                            fclose(pFVar17);
                            uVar33 = local_148;
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x455,"Done building questions using state %d\n",
                                    local_148 & 0xffffffff);
                            uVar14 = local_68;
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x456," %d questions from state %d\n",(ulong)local_68,
                                    uVar33 & 0xffffffff);
                            ppiVar21 = local_f8;
                            ppppvVar19 = local_110;
                            if (0 < (int)uVar14) {
                              uVar33 = 0;
                              do {
                                ckd_free(ppiVar21[uVar33]);
                                uVar33 = uVar33 + 1;
                              } while (uVar27 != uVar33);
                            }
                          }
                          ckd_free(ppiVar21);
                          ckd_free(piVar22);
                          local_148 = local_148 + 1;
                        } while (local_148 != local_98);
                      }
                      err_msg(ERR_INFO,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                              ,0x45b,"Stored questions in %s\n",local_a0);
                      return 0;
                    }
                    err_msg(ERR_FATAL,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x37d,"N-Feat = %d! N-Feat > 1 not implemented yet..\n");
                  }
                  else {
                    err_msg(ERR_FATAL,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x37a,"Total no. of states %d in var file != %d in mean file\n",
                            (ulong)t_nstates);
                  }
                  goto LAB_00105ca2;
                }
                pcVar16 = "Mismatch between Variance and Mixture weight files\n";
                lVar25 = 0x375;
                goto LAB_00105cbf;
              }
              pcVar15 = cmd_ln_get();
              pcVar16 = cmd_ln_str_r(pcVar15,"-varfn");
              pcVar24 = "Error reading var file %s\n";
              lVar25 = 0x369;
            }
            goto LAB_00105e50;
          }
        }
        pcVar16 = "Initialization failed\n";
        lVar25 = 0x421;
      }
LAB_00105cbf:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
              ,lVar25,pcVar16);
      goto LAB_00105ca2;
    }
    pcVar24 = "Unable to open %s for writing!\n";
    lVar25 = 0x413;
    pcVar16 = local_a0;
  }
  else {
    iVar12 = strcmp(pcVar16,".semi.");
    local_d8 = 0;
    if (iVar12 == 0) goto LAB_00104c5f;
    pcVar24 = "Unknown type %s, either \".cont.\" or \".semi.\"\n";
    lVar25 = 0x406;
  }
LAB_00105e50:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
          ,lVar25,pcVar24,pcVar16);
LAB_00105ca2:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    float32 ****mixw = NULL,***lmixw = NULL;
    float32 ***means = NULL, **lmeans = NULL;
    float32 ***vars = NULL, **lvars = NULL;
    uint32 veclen = 0;
    uint32 n_model = 0;
    uint32 n_state = 0;
    uint32 n_feat = 0;
    uint32 n_density = 0;
    uint32 state;
    uint32 npermute, nquests_per_state;
    int32 i, j, k, continuous, **questarr, *nquestphone, nquests=0;
    int32  *phoneids,nphones;
    char   **phone_list = NULL;
    const char   *outfile;
    node   *root;
    FILE   *fp;
    const char* type;

    parse_cmd_ln(argc, argv);

    type = cmd_ln_str("-type");
    
    if(type==NULL){
      E_FATAL("-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n");
    }

    continuous = -1;
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else if (strcmp(type,".semi.") == 0) 
        continuous = 0;
    else{
      E_FATAL("Unknown type %s, either \".cont.\" or \".semi.\"\n", type);
    }
      
    if(continuous ==-1){
      E_FATAL("-type is not set correctly\n");
    }

    outfile = cmd_ln_str("-questfn");
    npermute = cmd_ln_int32("-npermute");
    nquests_per_state = cmd_ln_int32("-qstperstt");

    /* Test and cleanup outfile */
    if ((fp = fopen(outfile,"w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",outfile);
    fprintf(fp,"WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n");
    fclose(fp);

    if (init(&mixw,
             &means,
             &vars,
             &veclen,
	     &n_model,
	     &n_state,
	     &n_feat,
             &n_density,
	     &phone_list,
	     continuous) != S3_SUCCESS) {
	E_FATAL("Initialization failed\n");
    }

    for (state = 0; state < n_state; state++){
        phoneids = (int32 *) ckd_calloc(n_model,sizeof(int32));
        root = (node *) ckd_calloc(1,sizeof(node));
        nphones = n_model;
        lmixw = (float32 ***)ckd_calloc_3d(n_model,n_feat,n_density,sizeof(float32));
        if (continuous) {
            lmeans = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            lvars = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                lmixw[i][0][0] = mixw[i][state][0][0];
                for (j=0;j<veclen;j++){
                    lmeans[i][j] = means[i][state][j];
                    lvars[i][j] = vars[i][state][j];
                }
            }
        }
        else {
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                for (j=0;j<n_feat;j++)
                    for (k=0;k<n_density;k++)
                        lmixw[i][j][k] = mixw[i][state][j][k];
            }
        }
        root = make_tree(lmeans,lvars,lmixw,phoneids,nphones,n_density,n_feat,veclen,npermute,0, continuous);
        if (continuous) {
            ckd_free_2d((void **)lmeans); ckd_free_2d((void **)lvars); 
        }
        ckd_free_3d((void ***)lmixw); ckd_free((void *)phoneids);

        questarr = (int32 **)ckd_calloc(n_state*n_model,sizeof(int32 *));
        nquestphone = (int32 *)ckd_calloc(n_state*n_model,sizeof(int32));

        prune_quests(root,nquests_per_state);
        nquests = get_quests(root,questarr,nquestphone,0,0);

        free_tree(root);

        fp = fopen(outfile,"a");
        for (i=0;i<nquests;i++){
            if (state < n_state/2) fprintf(fp,"QUESTION%d_%d_R ",state,i);
            else if (state == n_state/2) fprintf(fp,"QUESTION%d ",i);
            else fprintf(fp,"QUESTION%d_%d_L ",state,i);
            for (j=0;j<nquestphone[i];j++) 
                fprintf(fp," %s",phone_list[questarr[i][j]]);
            fprintf(fp,"\n");
        }
        fclose(fp);
        E_INFO("Done building questions using state %d\n",state);
        E_INFO(" %d questions from state %d\n",nquests,state);
        for(i=0;i<nquests;i++) ckd_free((void *)questarr[i]);
        ckd_free((void **)questarr);
        ckd_free((void *)nquestphone);
    }
    E_INFO ("Stored questions in %s\n",outfile);
    return 0;
}